

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     sort2<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (pair<int,_int> *a,pair<int,_int> *b)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = std::operator<(b,a);
  if (bVar2) {
    iVar1 = a->first;
    a->first = b->first;
    b->first = iVar1;
    iVar1 = a->second;
    a->second = b->second;
    b->second = iVar1;
  }
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }